

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O2

void aom_hadamard_lp_8x8_dual_avx2(int16_t *src_diff,ptrdiff_t src_stride,int16_t *coeff)

{
  int16_t *piVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  __m256i src [8];
  longlong local_120;
  longlong lStack_118;
  longlong lStack_110;
  longlong lStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  
  local_120 = *(longlong *)src_diff;
  lStack_118 = *(longlong *)(src_diff + 4);
  lStack_110 = *(longlong *)(src_diff + 8);
  lStack_108 = *(longlong *)(src_diff + 0xc);
  piVar1 = src_diff + src_stride;
  local_100 = *(undefined8 *)piVar1;
  uStack_f8 = *(undefined8 *)(piVar1 + 4);
  uStack_f0 = *(undefined8 *)(piVar1 + 8);
  uStack_e8 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_e0 = *(undefined8 *)piVar1;
  uStack_d8 = *(undefined8 *)(piVar1 + 4);
  uStack_d0 = *(undefined8 *)(piVar1 + 8);
  uStack_c8 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_c0 = *(undefined8 *)piVar1;
  uStack_b8 = *(undefined8 *)(piVar1 + 4);
  uStack_b0 = *(undefined8 *)(piVar1 + 8);
  uStack_a8 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_a0 = *(undefined8 *)piVar1;
  uStack_98 = *(undefined8 *)(piVar1 + 4);
  uStack_90 = *(undefined8 *)(piVar1 + 8);
  uStack_88 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_80 = *(undefined8 *)piVar1;
  uStack_78 = *(undefined8 *)(piVar1 + 4);
  uStack_70 = *(undefined8 *)(piVar1 + 8);
  uStack_68 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_60 = *(undefined8 *)piVar1;
  uStack_58 = *(undefined8 *)(piVar1 + 4);
  uStack_50 = *(undefined8 *)(piVar1 + 8);
  uStack_48 = *(undefined8 *)(piVar1 + 0xc);
  piVar1 = piVar1 + src_stride;
  local_40 = *(undefined8 *)piVar1;
  uStack_38 = *(undefined8 *)(piVar1 + 4);
  uStack_30 = *(undefined8 *)(piVar1 + 8);
  uStack_28 = *(undefined8 *)(piVar1 + 0xc);
  hadamard_col8x2_avx2((__m256i *)&local_120,0);
  hadamard_col8x2_avx2((__m256i *)&local_120,1);
  auVar3._8_8_ = lStack_118;
  auVar3._0_8_ = local_120;
  auVar3._16_8_ = lStack_110;
  auVar3._24_8_ = lStack_108;
  auVar4._8_8_ = uStack_f8;
  auVar4._0_8_ = local_100;
  auVar4._16_8_ = uStack_f0;
  auVar4._24_8_ = uStack_e8;
  auVar2 = vperm2f128_avx(auVar3,auVar4,0x20);
  *(undefined1 (*) [32])coeff = auVar2;
  auVar5._8_8_ = uStack_d8;
  auVar5._0_8_ = local_e0;
  auVar5._16_8_ = uStack_d0;
  auVar5._24_8_ = uStack_c8;
  auVar6._8_8_ = uStack_b8;
  auVar6._0_8_ = local_c0;
  auVar6._16_8_ = uStack_b0;
  auVar6._24_8_ = uStack_a8;
  auVar2 = vperm2f128_avx(auVar5,auVar6,0x20);
  *(undefined1 (*) [32])(coeff + 0x10) = auVar2;
  auVar7._8_8_ = uStack_98;
  auVar7._0_8_ = local_a0;
  auVar7._16_8_ = uStack_90;
  auVar7._24_8_ = uStack_88;
  auVar8._8_8_ = uStack_78;
  auVar8._0_8_ = local_80;
  auVar8._16_8_ = uStack_70;
  auVar8._24_8_ = uStack_68;
  auVar2 = vperm2f128_avx(auVar7,auVar8,0x20);
  *(undefined1 (*) [32])(coeff + 0x20) = auVar2;
  auVar9._8_8_ = uStack_58;
  auVar9._0_8_ = local_60;
  auVar9._16_8_ = uStack_50;
  auVar9._24_8_ = uStack_48;
  auVar10._8_8_ = uStack_38;
  auVar10._0_8_ = local_40;
  auVar10._16_8_ = uStack_30;
  auVar10._24_8_ = uStack_28;
  auVar2 = vperm2f128_avx(auVar9,auVar10,0x20);
  *(undefined1 (*) [32])(coeff + 0x30) = auVar2;
  auVar2 = vperm2f128_avx(auVar3,auVar4,0x31);
  *(undefined1 (*) [32])(coeff + 0x40) = auVar2;
  auVar2 = vperm2f128_avx(auVar5,auVar6,0x31);
  *(undefined1 (*) [32])(coeff + 0x50) = auVar2;
  auVar2 = vperm2f128_avx(auVar7,auVar8,0x31);
  *(undefined1 (*) [32])(coeff + 0x60) = auVar2;
  auVar2 = vperm2f128_avx(auVar9,auVar10,0x31);
  *(undefined1 (*) [32])(coeff + 0x70) = auVar2;
  return;
}

Assistant:

void aom_hadamard_lp_8x8_dual_avx2(const int16_t *src_diff,
                                   ptrdiff_t src_stride, int16_t *coeff) {
  __m256i src[8];
  src[0] = _mm256_loadu_si256((const __m256i *)src_diff);
  src[1] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[2] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[3] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[4] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[5] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[6] = _mm256_loadu_si256((const __m256i *)(src_diff += src_stride));
  src[7] = _mm256_loadu_si256((const __m256i *)(src_diff + src_stride));

  hadamard_col8x2_avx2(src, 0);
  hadamard_col8x2_avx2(src, 1);

  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x20));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[0], src[1], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[2], src[3], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[4], src[5], 0x31));
  coeff += 16;
  _mm256_storeu_si256((__m256i *)coeff,
                      _mm256_permute2x128_si256(src[6], src[7], 0x31));
}